

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_direct.c
# Opt level: O1

SUNDlsMat SUNDlsMat_NewDenseMat(sunindextype M,sunindextype N)

{
  SUNDlsMat __ptr;
  realtype *__ptr_00;
  realtype **pprVar1;
  ulong uVar2;
  
  if (0 < N && 0 < M) {
    __ptr = (SUNDlsMat)malloc(0x38);
    if (__ptr != (SUNDlsMat)0x0) {
      __ptr_00 = (realtype *)malloc((ulong)(uint)(N * M) * 8);
      __ptr->data = __ptr_00;
      if (__ptr_00 != (realtype *)0x0) {
        pprVar1 = (realtype **)malloc((ulong)(uint)N * 8);
        __ptr->cols = pprVar1;
        if (pprVar1 != (realtype **)0x0) {
          if (0 < N) {
            uVar2 = 0;
            do {
              pprVar1[uVar2] = __ptr_00;
              uVar2 = uVar2 + 1;
              __ptr_00 = __ptr_00 + (uint)M;
            } while ((uint)N != uVar2);
          }
          __ptr->M = M;
          __ptr->N = N;
          __ptr->ldim = M;
          __ptr->ldata = N * M;
          __ptr->type = 1;
          return __ptr;
        }
        free(__ptr_00);
        __ptr->data = (realtype *)0x0;
      }
      free(__ptr);
    }
  }
  return (SUNDlsMat)0x0;
}

Assistant:

SUNDlsMat SUNDlsMat_NewDenseMat(sunindextype M, sunindextype N)
{
  SUNDlsMat A;
  sunindextype j;

  if ( (M <= 0) || (N <= 0) ) return(NULL);

  A = NULL;
  A = (SUNDlsMat) malloc(sizeof *A);
  if (A==NULL) return (NULL);

  A->data = (realtype *) malloc(M * N * sizeof(realtype));
  if (A->data == NULL) {
    free(A); A = NULL;
    return(NULL);
  }
  A->cols = (realtype **) malloc(N * sizeof(realtype *));
  if (A->cols == NULL) {
    free(A->data); A->data = NULL;
    free(A); A = NULL;
    return(NULL);
  }

  for (j=0; j < N; j++) A->cols[j] = A->data + j * M;

  A->M = M;
  A->N = N;
  A->ldim = M;
  A->ldata = M*N;

  A->type = SUNDIALS_DENSE;

  return(A);
}